

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O1

void __thiscall ipx::ForrestTomlin::ComputeSpike(ForrestTomlin *this,Int nb,Int *bi,double *bx)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  size_t sVar5;
  double *pdVar6;
  pointer piVar7;
  pointer pdVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  double dVar13;
  
  piVar3 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar5 = (this->work_)._M_size;
  pdVar6 = (this->work_)._M_data;
  if (sVar5 != 0) {
    memset(pdVar6,0,sVar5 << 3);
  }
  if (0 < nb) {
    piVar7 = (this->rowperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      pdVar6[piVar7[bi[uVar10]]] = bx[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uint)nb != uVar10);
  }
  TriangularSolve(&this->L_,&this->work_,'n',"lower",1);
  uVar12 = (uint)((ulong)((long)piVar3 - (long)piVar4) >> 2);
  if (0 < (int)uVar12) {
    piVar3 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->work_)._M_data;
    piVar4 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = this->dim_;
    uVar10 = 0;
    do {
      iVar1 = piVar4[uVar10];
      lVar11 = (long)iVar1;
      iVar2 = piVar4[uVar10 + 1];
      dVar13 = 0.0;
      if (iVar1 < iVar2) {
        do {
          dVar13 = dVar13 + pdVar6[piVar7[lVar11]] * pdVar8[lVar11];
          lVar11 = lVar11 + 1;
        } while (iVar2 != lVar11);
      }
      iVar1 = piVar3[uVar10];
      pdVar6[(long)iVar9 + uVar10] = pdVar6[iVar1] - dVar13;
      pdVar6[iVar1] = 0.0;
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar12 & 0x7fffffff));
  }
  SparseMatrix::clear_queue(&this->U_);
  iVar9 = this->dim_ + uVar12;
  if (iVar9 != 0 && SCARRY4(this->dim_,uVar12) == iVar9 < 0) {
    lVar11 = 0;
    do {
      dVar13 = (this->work_)._M_data[lVar11];
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        SparseMatrix::push_back(&this->U_,(Int)lVar11,dVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)this->dim_ + (long)(int)uVar12);
  }
  this->have_ftran_ = true;
  return;
}

Assistant:

void ForrestTomlin::ComputeSpike(Int nb, const Int* bi, const double* bx) {
    Int num_updates = replaced_.size();

    // Solve L*lhs=b.
    work_ = 0.0;
    for (Int p = 0; p < nb; p++)
        work_[rowperm_inv_[bi[p]]] = bx[p];
    TriangularSolve(L_, work_, 'n', "lower", 1);

    // Apply update etas.
    for (Int k = 0; k < num_updates; k++) {
        work_[dim_+k] = work_[replaced_[k]] - DotColumn(R_, k, work_);
        work_[replaced_[k]] = 0.0;
    }

    // Store spike in U. Indices are sorted, which is required for the sparse
    // dot product in Update().
    U_.clear_queue();
    for (Int p = 0; p < dim_+num_updates; p++) {
        if (work_[p] != 0.0)
            U_.push_back(p, work_[p]);
    }
    have_ftran_ = true;
}